

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.hpp
# Opt level: O1

void __thiscall efsw::Watcher::~Watcher(Watcher *this)

{
  pointer pcVar1;
  
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_0012ebc0;
  pcVar1 = (this->OldFileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->OldFileName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Directory).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Watcher() {}